

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

Token * __thiscall wabt::WastLexer::GetNanToken(Token *__return_storage_ptr__,WastLexer *this)

{
  int iVar1;
  byte *pbVar2;
  byte *pbVar3;
  long lVar4;
  byte *pbVar5;
  byte *pbVar6;
  uint uVar7;
  bool bVar8;
  
  pbVar3 = (byte *)this->cursor_;
  bVar8 = false;
  lVar4 = 0;
  pbVar2 = pbVar3;
  do {
    uVar7 = 0xffffffff;
    pbVar5 = pbVar2;
    if (pbVar2 < this->buffer_end_) {
      pbVar5 = pbVar2 + 1;
      this->cursor_ = (char *)pbVar5;
      uVar7 = (uint)*pbVar2;
    }
    if (uVar7 != (int)"nan"[lVar4]) {
      this->cursor_ = (char *)pbVar3;
      break;
    }
    lVar4 = lVar4 + 1;
    bVar8 = lVar4 == 3;
    pbVar2 = pbVar5;
  } while (!bVar8);
  if (bVar8) {
    pbVar3 = (byte *)this->buffer_end_;
    pbVar2 = (byte *)this->cursor_;
    if (pbVar2 < pbVar3) {
      bVar8 = *pbVar2 == 0x3a;
    }
    else {
      bVar8 = false;
    }
    if (bVar8 && pbVar2 < pbVar3) {
      this->cursor_ = (char *)(pbVar2 + 1);
    }
    pbVar2 = (byte *)this->cursor_;
    if (bVar8) {
      bVar8 = false;
      lVar4 = 0;
      pbVar5 = pbVar2;
      do {
        uVar7 = 0xffffffff;
        pbVar6 = pbVar5;
        if (pbVar5 < pbVar3) {
          pbVar6 = pbVar5 + 1;
          this->cursor_ = (char *)pbVar6;
          uVar7 = (uint)*pbVar5;
        }
        if (uVar7 != (int)":0x"[lVar4 + 1]) {
          this->cursor_ = (char *)pbVar2;
          break;
        }
        lVar4 = lVar4 + 1;
        bVar8 = lVar4 == 2;
        pbVar5 = pbVar6;
      } while (!bVar8);
      if ((!bVar8) || (bVar8 = ReadHexNum(this), !bVar8)) goto LAB_00159f7b;
      pbVar3 = (byte *)this->cursor_;
      iVar1 = 0;
      while( true ) {
        if (pbVar3 < this->buffer_end_) {
          lVar4 = (ulong)*pbVar3 + 1;
        }
        else {
          lVar4 = 0;
        }
        if ((""[lVar4] & 1U) == 0) break;
        if (pbVar3 < this->buffer_end_) {
          pbVar3 = pbVar3 + 1;
          this->cursor_ = (char *)pbVar3;
        }
        iVar1 = iVar1 + -1;
      }
    }
    else {
      iVar1 = 0;
      while( true ) {
        if (pbVar2 < pbVar3) {
          lVar4 = (ulong)*pbVar2 + 1;
        }
        else {
          lVar4 = 0;
        }
        if ((""[lVar4] & 1U) == 0) break;
        if (pbVar2 < pbVar3) {
          pbVar2 = pbVar2 + 1;
          this->cursor_ = (char *)pbVar2;
        }
        iVar1 = iVar1 + -1;
      }
    }
    if (iVar1 == 0) {
      LiteralToken(__return_storage_ptr__,this,First_Literal,Nan);
      return __return_storage_ptr__;
    }
  }
LAB_00159f7b:
  GetKeywordToken(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetNanToken() {
  if (MatchString("nan")) {
    if (MatchChar(':')) {
      if (MatchString("0x") && ReadHexNum() && NoTrailingReservedChars()) {
        return LiteralToken(TokenType::Float, LiteralType::Nan);
      }
    } else if (NoTrailingReservedChars()) {
      return LiteralToken(TokenType::Float, LiteralType::Nan);
    }
  }
  return GetKeywordToken();
}